

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolk.c
# Opt level: O0

int ffg3dk(fitsfile *fptr,long group,int nulval,LONGLONG ncols,LONGLONG nrows,LONGLONG naxis1,
          LONGLONG naxis2,LONGLONG naxis3,int *array,int *anynul,int *status)

{
  int iVar1;
  LONGLONG local_e8;
  int local_dc;
  LONGLONG LStack_d8;
  int nullvalue;
  LONGLONG lpixel [3];
  long local_b8;
  LONGLONG narray;
  LONGLONG nfits;
  LONGLONG fpixel [3];
  long local_88;
  long inc [3];
  int nullcheck;
  char cdummy;
  long jj;
  long ii;
  long tablerow;
  LONGLONG naxis1_local;
  LONGLONG nrows_local;
  LONGLONG ncols_local;
  int nulval_local;
  long group_local;
  fitsfile *fptr_local;
  
  inc[2]._0_4_ = 1;
  local_88 = 1;
  inc[0] = 1;
  inc[1] = 1;
  nfits = 1;
  fpixel[0] = 1;
  fpixel[1] = 1;
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    local_e8 = group;
    if (group < 1) {
      local_e8 = 1;
    }
    if ((ncols == naxis1) && (nrows == naxis2)) {
      ffgclk(fptr,2,local_e8,1,naxis1 * naxis2 * naxis3,1,1,nulval,array,(char *)((long)inc + 0x17),
             anynul,status);
      fptr_local._4_4_ = *status;
    }
    else if ((ncols < naxis1) || (nrows < naxis2)) {
      *status = 0x140;
      fptr_local._4_4_ = 0x140;
    }
    else {
      narray = 1;
      local_b8 = 0;
      for (_nullcheck = 0; _nullcheck < naxis3; _nullcheck = _nullcheck + 1) {
        for (jj = 0; jj < naxis2; jj = jj + 1) {
          iVar1 = ffgclk(fptr,2,local_e8,narray,naxis1,1,1,nulval,array + local_b8,
                         (char *)((long)inc + 0x17),anynul,status);
          if (0 < iVar1) {
            return *status;
          }
          narray = naxis1 + narray;
          local_b8 = ncols + local_b8;
        }
        local_b8 = (nrows - naxis2) * ncols + local_b8;
      }
      fptr_local._4_4_ = *status;
    }
  }
  else {
    lpixel[1] = naxis3;
    local_dc = nulval;
    LStack_d8 = ncols;
    lpixel[0] = nrows;
    fits_read_compressed_img
              (fptr,0x1f,&nfits,&stack0xffffffffffffff28,&local_88,(int)inc[2],&local_dc,array,
               (char *)0x0,anynul,status);
    fptr_local._4_4_ = *status;
  }
  return fptr_local._4_4_;
}

Assistant:

int ffg3dk(fitsfile *fptr,  /* I - FITS file pointer                       */
           long  group,     /* I - group to read (1 = 1st group)           */
           int   nulval,    /* set undefined pixels equal to this          */
           LONGLONG  ncols,     /* I - number of pixels in each row of array   */
           LONGLONG  nrows,     /* I - number of rows in each plane of array   */
           LONGLONG  naxis1,    /* I - FITS image NAXIS1 value                 */
           LONGLONG  naxis2,    /* I - FITS image NAXIS2 value                 */
           LONGLONG  naxis3,    /* I - FITS image NAXIS3 value                 */
           int   *array,    /* O - array to be filled and returned         */
           int  *anynul,    /* O - set to 1 if any values are null; else 0 */
           int  *status)    /* IO - error status                           */
/*
  Read an entire 3-D array of values to the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of the
  FITS array is not the same as the array being read).  Any null
  values in the array will be set equal to the value of nulval, unless
  nulval = 0 in which case no null checking will be performed.
*/
{
    long tablerow, ii, jj;
    char cdummy;
    int nullcheck = 1;
    long inc[] = {1,1,1};
    LONGLONG fpixel[] = {1,1,1}, nfits, narray;
    LONGLONG lpixel[3];
    int nullvalue;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */

        lpixel[0] = ncols;
        lpixel[1] = nrows;
        lpixel[2] = naxis3;
        nullvalue = nulval;  /* set local variable */

        fits_read_compressed_img(fptr, TINT, fpixel, lpixel, inc,
            nullcheck, &nullvalue, array, NULL, anynul, status);
        return(*status);
    }

    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */
    tablerow=maxvalue(1,group);

    if (ncols == naxis1 && nrows == naxis2)  /* arrays have same size? */
    {
       /* all the image pixels are contiguous, so read all at once */
       ffgclk(fptr, 2, tablerow, 1, naxis1 * naxis2 * naxis3, 1, 1, nulval,
               array, &cdummy, anynul, status);
       return(*status);
    }

    if (ncols < naxis1 || nrows < naxis2)
       return(*status = BAD_DIMEN);

    nfits = 1;   /* next pixel in FITS image to read */
    narray = 0;  /* next pixel in output array to be filled */

    /* loop over naxis3 planes in the data cube */
    for (jj = 0; jj < naxis3; jj++)
    {
      /* loop over the naxis2 rows in the FITS image, */
      /* reading naxis1 pixels to each row            */

      for (ii = 0; ii < naxis2; ii++)
      {
       if (ffgclk(fptr, 2, tablerow, nfits, naxis1, 1, 1, nulval,
          &array[narray], &cdummy, anynul, status) > 0)
          return(*status);

       nfits += naxis1;
       narray += ncols;
      }
      narray += (nrows - naxis2) * ncols;
    }

    return(*status);
}